

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgc2mgc.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined7 uVar5;
  size_t sVar4;
  uint uVar6;
  string *this;
  char *__s;
  long lVar7;
  long lVar8;
  bool bVar9;
  int output_num_order;
  int input_num_order;
  double input_gamma;
  double output_gamma;
  double output_alpha;
  double input_alpha;
  ostringstream error_message_11;
  ifstream ifs;
  vector<double,_std::allocator<double>_> transformed_mel_generalized_cepstrum;
  vector<double,_std::allocator<double>_> mel_generalized_cepstrum;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum mel_generalized_cepstrum_transform;
  Buffer buffer;
  int local_4f0;
  int local_4ec;
  double local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  double local_4d0;
  ulong local_4c8;
  undefined8 local_4c0;
  double local_4b8;
  double local_4b0;
  string local_4a8;
  string local_488 [3];
  ios_base local_418 [264];
  string local_310;
  byte abStack_2f0 [80];
  ios_base local_2a0 [408];
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum local_d8;
  Buffer local_70;
  
  local_4ec = 0x19;
  local_4b0 = 0.0;
  local_4e8 = 0.0;
  local_4f0 = 0x19;
  local_4c0 = 0;
  local_4b8 = 0.0;
  local_4d0 = 1.0;
  local_4d8 = 0;
  local_4c8 = 0;
  local_4e0 = 0;
LAB_0010382b:
  iVar3 = ya_getopt_long(argc,argv,"m:a:g:c:nuM:A:G:C:NUh",(option *)0x0,(int *)0x0);
  uVar5 = (undefined7)(CONCAT44(extraout_var,iVar3) >> 8);
  if (iVar3 < 0x55) {
    if (iVar3 < 0x47) {
      if (iVar3 == 0x41) {
        std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
        bVar1 = sptk::ConvertStringToDouble(&local_310,&local_4b8);
        if (bVar1) {
          bVar1 = sptk::IsValidAlpha(local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p);
          }
          if (bVar1) goto LAB_0010382b;
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_310,"The argument for the -A option must be in (-1.0, 1.0)",
                   0x35);
        local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
      }
      else if (iVar3 == 0x43) {
        std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
        bVar9 = sptk::ConvertStringToInteger(&local_310,(int *)&local_d8);
        bVar1 = 0 < (int)local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if (bVar9 && bVar1) {
          local_4d0 = -1.0 / (double)(int)local_d8.
                                          _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
          goto LAB_0010382b;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_310,"The argument for the -C option must be a positive integer"
                   ,0x39);
        local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
        sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
      }
      else {
        if (iVar3 != -1) goto switchD_00103889_caseD_1;
        if (((local_4e8 != 0.0) || (NAN(local_4e8))) || ((local_4c8 & 1) == 0)) {
          if (argc - ya_optind < 2) {
            if (argc == ya_optind) {
              __s = (char *)0x0;
            }
            else {
              __s = argv[ya_optind];
            }
            bVar1 = sptk::SetBinaryMode();
            this = &local_310;
            if (bVar1) {
              std::ifstream::ifstream(this);
              if ((__s != (char *)0x0) &&
                 (std::ifstream::open((char *)&local_310,(_Ios_Openmode)__s),
                 (abStack_2f0[*(long *)(local_310._M_dataplus._M_p + -0x18)] & 5) != 0)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"Cannot open file ",0x11);
                sVar4 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,__s,sVar4);
                local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum =
                     (_func_int **)&local_d8.input_alpha_;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"mgc2mgc","");
                sptk::PrintErrorMessage((string *)&local_d8,(ostringstream *)local_488);
                if (local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum !=
                    (_func_int **)&local_d8.input_alpha_) {
                  operator_delete(local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
                std::ios_base::~ios_base(local_418);
                iVar3 = 1;
                goto LAB_001045d5;
              }
              cVar2 = std::__basic_file<char>::is_open();
              if (cVar2 == '\0') {
                this = (string *)&std::cin;
              }
              sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
              MelGeneralizedCepstrumToMelGeneralizedCepstrum
                        (&local_d8,local_4ec,local_4b0,local_4e8,(bool)((byte)local_4e0 & 1),
                         (bool)((byte)local_4c8 & 1),local_4f0,local_4b8,local_4d0,
                         (bool)((byte)local_4d8 & 1),(bool)((byte)local_4c0 & 1));
              local_70._vptr_Buffer = (_func_int **)&PTR__Buffer_00112a18;
              local_70.frequency_transform_buffer_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_00112a48;
              local_70.frequency_transform_buffer_.d_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              local_70.frequency_transform_buffer_.d_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              local_70.frequency_transform_buffer_.d_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              local_70.temporary_mel_generalized_cepstrum_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              local_70.temporary_mel_generalized_cepstrum_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              local_70.temporary_mel_generalized_cepstrum_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              if (local_d8.is_valid_ != false) {
                lVar7 = (long)local_4ec;
                lVar8 = (long)local_4f0;
                std::vector<double,_std::allocator<double>_>::vector
                          (&local_f0,lVar7 + 1U,(allocator_type *)local_488);
                std::vector<double,_std::allocator<double>_>::vector
                          (&local_108,lVar8 + 1U,(allocator_type *)local_488);
                local_4e0 = CONCAT71((int7)(local_4e0 >> 8),(byte)local_4e0 | (byte)local_4c8 ^ 1);
                local_4d8 = CONCAT71((int7)(local_4d8 >> 8),(byte)local_4d8 | (byte)local_4c0 ^ 1);
                goto LAB_00104371;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"Failed to initialize ",0x15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"MelGeneralizedCepstrumToMelGeneralizedCepstrum",0x2e)
              ;
              local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"mgc2mgc","");
              sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_488);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                operator_delete(local_4a8._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              std::ios_base::~ios_base(local_418);
              iVar3 = 1;
              goto LAB_001045bb;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,"Cannot set translation mode",0x1b);
            local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
            sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_310,"Too many input files",0x14);
            local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
            sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_310,"If -u option is given, input gamma must not be 0",0x30);
          local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
          sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
        }
      }
    }
    else if (iVar3 == 0x47) {
      std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
      bVar1 = sptk::ConvertStringToDouble(&local_310,&local_4d0);
      if (bVar1) {
        bVar1 = sptk::IsValidGamma(local_4d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if (bVar1) goto LAB_0010382b;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"The argument for the -G option must be in [-1.0, 1.0]",0x35)
      ;
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
    }
    else {
      if (iVar3 != 0x4d) {
        if (iVar3 != 0x4e) goto switchD_00103889_caseD_1;
        local_4d8 = CONCAT71(uVar5,1);
        goto LAB_0010382b;
      }
      std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
      bVar1 = sptk::ConvertStringToInteger(&local_310,&local_4f0);
      bVar9 = -1 < local_4f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if (bVar1 && bVar9) goto LAB_0010382b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"The argument for the -M option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"non-negative integer",0x14);
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
    }
  }
  else {
    uVar6 = iVar3 - 0x61;
    if (0xd < uVar6) {
      if (iVar3 == 0x55) {
        local_4c0 = CONCAT71(uVar5,1);
      }
      else {
        local_4c8 = CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
        if (iVar3 != 0x75) {
switchD_00103889_caseD_1:
          anon_unknown.dwarf_2d71::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
      }
      goto LAB_0010382b;
    }
    switch(uVar6) {
    case 0:
      std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
      bVar1 = sptk::ConvertStringToDouble(&local_310,&local_4b0);
      if (bVar1) {
        bVar1 = sptk::IsValidAlpha(local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if (bVar1) goto LAB_0010382b;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"The argument for the -a option must be in (-1.0, 1.0)",0x35)
      ;
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
      break;
    default:
      goto switchD_00103889_caseD_1;
    case 2:
      std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
      bVar9 = sptk::ConvertStringToInteger(&local_310,(int *)&local_d8);
      bVar1 = 0 < (int)local_d8._vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if (bVar9 && bVar1) {
        local_4e8 = -1.0 / (double)(int)local_d8.
                                        _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
        goto LAB_0010382b;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"The argument for the -c option must be a positive integer",
                 0x39);
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
      break;
    case 6:
      std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
      bVar1 = sptk::ConvertStringToDouble(&local_310,&local_4e8);
      if (bVar1) {
        bVar1 = sptk::IsValidGamma(local_4e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if (bVar1) goto LAB_0010382b;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"The argument for the -g option must be in [-1.0, 1.0]",0x35)
      ;
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
      break;
    case 7:
      anon_unknown.dwarf_2d71::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0xc:
      std::__cxx11::string::string((string *)&local_310,ya_optarg,(allocator *)local_488);
      bVar1 = sptk::ConvertStringToInteger(&local_310,&local_4ec);
      bVar9 = -1 < local_4ec;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if (bVar1 && bVar9) goto LAB_0010382b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"non-negative integer",0x14);
      local_488[0]._M_dataplus._M_p = (pointer)&local_488[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mgc2mgc","");
      sptk::PrintErrorMessage(local_488,(ostringstream *)&local_310);
      break;
    case 0xd:
      local_4e0 = CONCAT71((int7)((ulong)((long)&switchD_00103889::switchdataD_0010d018 +
                                         (long)(int)(&switchD_00103889::switchdataD_0010d018)[uVar6]
                                         ) >> 8),1);
      goto LAB_0010382b;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488[0]._M_dataplus._M_p != &local_488[0].field_2) {
    operator_delete(local_488[0]._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
  std::ios_base::~ios_base(local_2a0);
  return 1;
LAB_00104371:
  bVar1 = sptk::ReadStream<double>(false,0,0,(int)(lVar7 + 1U),&local_f0,(istream *)this,(int *)0x0)
  ;
  if (!bVar1) {
    iVar3 = 0;
    goto LAB_00104597;
  }
  if ((local_4e0 & 1) == 0) {
    *local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = (*local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + -1.0) / local_4e8;
  }
  bVar1 = sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
                    (&local_d8,&local_f0,&local_108,&local_70);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_488,"Failed to run mel-generalized cepstral transformation",0x35);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"mgc2mgc","");
    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_488);
    goto LAB_00104565;
  }
  if ((local_4d8 & 1) == 0) {
    *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start * local_4d0 + 1.0;
  }
  bVar1 = sptk::WriteStream<double>(0,(int)(lVar8 + 1U),&local_108,(ostream *)&std::cout,(int *)0x0)
  ;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_488,"Failed to write mel-generalized cepstrum",0x28);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"mgc2mgc","");
    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_488);
LAB_00104565:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
    std::ios_base::~ios_base(local_418);
    iVar3 = 1;
LAB_00104597:
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_001045bb:
    sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::~Buffer(&local_70);
    sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
    ~MelGeneralizedCepstrumToMelGeneralizedCepstrum(&local_d8);
LAB_001045d5:
    std::ifstream::~ifstream(&local_310);
    return iVar3;
  }
  goto LAB_00104371;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_num_order(kDefaultInputNumOrder);
  double input_alpha(kDefaultInputAlpha);
  double input_gamma(kDefaultInputGamma);
  bool input_normalization_flag(kDefaultInputNormalizationFlag);
  bool input_multiplication_flag(kDefaultInputMultiplicationFlag);
  int output_num_order(kDefaultOutputNumOrder);
  double output_alpha(kDefaultOutputAlpha);
  double output_gamma(kDefaultOutputGamma);
  bool output_normalization_flag(kDefaultOutputNormalizationFlag);
  bool output_multiplication_flag(kDefaultOutputMultiplicationFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:nuM:A:G:C:NUh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_num_order) ||
            input_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &input_alpha) ||
            !sptk::IsValidAlpha(input_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &input_gamma) ||
            !sptk::IsValidGamma(input_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        input_gamma = -1.0 / tmp;
        break;
      }
      case 'n': {
        input_normalization_flag = true;
        break;
      }
      case 'u': {
        input_multiplication_flag = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_num_order) ||
            output_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'A': {
        if (!sptk::ConvertStringToDouble(optarg, &output_alpha) ||
            !sptk::IsValidAlpha(output_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -A option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'G': {
        if (!sptk::ConvertStringToDouble(optarg, &output_gamma) ||
            !sptk::IsValidGamma(output_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -G option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -C option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        output_gamma = -1.0 / tmp;
        break;
      }
      case 'N': {
        output_normalization_flag = true;
        break;
      }
      case 'U': {
        output_multiplication_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0.0 == input_gamma && input_multiplication_flag) {
    std::ostringstream error_message;
    error_message << "If -u option is given, input gamma must not be 0";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum
      mel_generalized_cepstrum_transform(
          input_num_order, input_alpha, input_gamma, input_normalization_flag,
          input_multiplication_flag, output_num_order, output_alpha,
          output_gamma, output_normalization_flag, output_multiplication_flag);
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer buffer;
  if (!mel_generalized_cepstrum_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "MelGeneralizedCepstrumToMelGeneralizedCepstrum";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int input_length(input_num_order + 1);
  const int output_length(output_num_order + 1);
  std::vector<double> mel_generalized_cepstrum(input_length);
  std::vector<double> transformed_mel_generalized_cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &mel_generalized_cepstrum,
                          &input_stream, NULL)) {
    // Perform input modification: 1+g*mgc[0] -> mgc[0]
    if (!input_normalization_flag && input_multiplication_flag)
      (*mel_generalized_cepstrum.begin()) =
          (*(mel_generalized_cepstrum.begin()) - 1.0) / input_gamma;

    // Transform.
    if (!mel_generalized_cepstrum_transform.Run(
            mel_generalized_cepstrum, &transformed_mel_generalized_cepstrum,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral transformation";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }

    // Perform output modification: mgc[0] -> 1+g*mgc[0]
    if (!output_normalization_flag && output_multiplication_flag)
      (*transformed_mel_generalized_cepstrum.begin()) =
          *(transformed_mel_generalized_cepstrum.begin()) * output_gamma + 1.0;

    // Write results.
    if (!sptk::WriteStream(0, output_length,
                           transformed_mel_generalized_cepstrum, &std::cout,
                           NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }

  return 0;
}